

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_button.cpp
# Opt level: O0

Am_Value option_button_value_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar3;
  Am_Object *in_RSI;
  Am_Value AVar4;
  undefined1 local_70 [8];
  Am_Value firstv;
  Am_Value_List items;
  Am_Value v;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object sub_menu;
  Am_Object *self_local;
  Am_Value *value;
  
  sub_menu.data._7_1_ = 0;
  Am_Value::Am_Value((Am_Value *)self);
  Am_Object::Get_Object(&local_30,(Am_Slot_Key)in_RSI,0x1d2);
  Am_Object::Get_Object(&local_28,(Am_Slot_Key)&local_30,0x1d2);
  Am_Object::~Am_Object(&local_30);
  pAVar2 = Am_Object::Peek(&local_28,0x169,0);
  Am_Value::operator=((Am_Value *)self,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)self);
  if (!bVar1) {
    Am_Value::Am_Value((Am_Value *)&items.item);
    pAVar2 = Am_Object::Peek(in_RSI,0xa2,0);
    Am_Value::operator=((Am_Value *)&items.item,pAVar2);
    Am_Value::operator=((Am_Value *)self,&Am_No_Value);
    bVar1 = Am_Value::Valid((Am_Value *)&items.item);
    if ((bVar1) && (bVar1 = Am_Value_List::Test((Am_Value *)&items.item), bVar1)) {
      Am_Value_List::Am_Value_List((Am_Value_List *)&firstv.value,(Am_Value *)&items.item);
      Am_Value::Am_Value((Am_Value *)local_70);
      Am_Value_List::Start((Am_Value_List *)&firstv.value);
      pAVar2 = Am_Value_List::Get((Am_Value_List *)&firstv.value);
      Am_Value::operator=((Am_Value *)local_70,pAVar2);
      while (bVar1 = Am_Value_List::Last((Am_Value_List *)&firstv.value), ((bVar1 ^ 0xffU) & 1) != 0
            ) {
        pAVar2 = Am_Value_List::Get((Am_Value_List *)&firstv.value);
        Am_Value::operator=((Am_Value *)self,pAVar2);
        bVar1 = Am_Value::Valid((Am_Value *)self);
        if ((bVar1) && (bVar1 = get_value_to_use_for_value_from((Am_Value *)self), bVar1)) {
          sub_menu.data._7_1_ = 1;
          bVar1 = true;
          goto LAB_00368b70;
        }
        Am_Value_List::Next((Am_Value_List *)&firstv.value);
      }
      Am_Value::operator=((Am_Value *)self,(Am_Value *)local_70);
      get_value_to_use_for_value_from((Am_Value *)self);
      bVar1 = false;
LAB_00368b70:
      Am_Value::~Am_Value((Am_Value *)local_70);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&firstv.value);
      if (!bVar1) goto LAB_00368b98;
    }
    else {
LAB_00368b98:
      bVar1 = false;
    }
    Am_Value::~Am_Value((Am_Value *)&items.item);
    if (bVar1) goto LAB_00368bc9;
  }
  sub_menu.data._7_1_ = 1;
LAB_00368bc9:
  Am_Object::~Am_Object(&local_28);
  aVar3 = extraout_RDX;
  if ((sub_menu.data._7_1_ & 1) == 0) {
    Am_Value::~Am_Value((Am_Value *)self);
    aVar3 = extraout_RDX_00;
  }
  AVar4.value.wrapper_value = aVar3.wrapper_value;
  AVar4._0_8_ = self;
  return AVar4;
}

Assistant:

Am_Define_Formula(Am_Value, option_button_value)
{
  Am_Value value;
  Am_Object sub_menu = self.Get_Object(Am_SUB_MENU).Get_Object(Am_SUB_MENU);
  value = sub_menu.Peek(Am_VALUE);
  if (!value.Valid()) {
    Am_Value v;
    v = self.Peek(Am_ITEMS);
    value = Am_No_Value;
    if (v.Valid() && Am_Value_List::Test(v)) {
      Am_Value_List items = v;
      Am_Value firstv;
      //search for a valid item
      items.Start();
      firstv = items.Get(); //save first item
      for (; !items.Last(); items.Next()) {
        value = items.Get();
        if (value.Valid()) {
          if (get_value_to_use_for_value_from(value))
            return value;
        }
      }
      //if get here, then all items are inactive, just use first one
      value = firstv;
      get_value_to_use_for_value_from(value);
    }
  }
  return value;
}